

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S_function.cpp
# Opt level: O1

Sequence * __thiscall
S_function::operator()(Sequence *__return_storage_ptr__,S_function *this,Sequence *seq)

{
  int begin;
  long lVar1;
  long lVar2;
  bool bVar3;
  vector<Sequence,_std::allocator<Sequence>_> seqs;
  Sequence subseq;
  vector<Sequence,_std::allocator<Sequence>_> local_f8;
  Sequence local_e0;
  Sequence local_88;
  
  std::vector<Sequence,_std::allocator<Sequence>_>::vector(&local_f8,8,(allocator_type *)&local_e0);
  lVar1 = 7;
  lVar2 = 0x270;
  begin = 0;
  do {
    Sequence::subsequence(&local_e0,seq,begin,begin + 6);
    Sbox::operator()(&local_88,this->m_sboxes[lVar1],&local_e0);
    std::deque<int,_std::allocator<int>_>::_M_move_assign1
              ((deque<int,_std::allocator<int>_> *)
               ((long)&(local_f8.super__Vector_base<Sequence,_std::allocator<Sequence>_>._M_impl.
                        super__Vector_impl_data._M_start)->_vptr_Sequence + lVar2),&local_88.m_bits)
    ;
    local_88._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_88.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    local_e0._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_e0.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    lVar2 = lVar2 + -0x58;
    bVar3 = lVar1 != 0;
    lVar1 = lVar1 + -1;
    begin = begin + 6;
  } while (bVar3);
  std::__cxx11::list<Sequence,std::allocator<Sequence>>::
  list<__gnu_cxx::__normal_iterator<Sequence*,std::vector<Sequence,std::allocator<Sequence>>>,void>
            ((list<Sequence,std::allocator<Sequence>> *)&local_e0,
             (__normal_iterator<Sequence_*,_std::vector<Sequence,_std::allocator<Sequence>_>_>)
             local_f8.super__Vector_base<Sequence,_std::allocator<Sequence>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<Sequence_*,_std::vector<Sequence,_std::allocator<Sequence>_>_>)
             local_f8.super__Vector_base<Sequence,_std::allocator<Sequence>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&local_88);
  Sequence::Sequence(__return_storage_ptr__,(list<Sequence,_std::allocator<Sequence>_> *)&local_e0);
  std::__cxx11::_List_base<Sequence,_std::allocator<Sequence>_>::_M_clear
            ((_List_base<Sequence,_std::allocator<Sequence>_> *)&local_e0);
  std::vector<Sequence,_std::allocator<Sequence>_>::~vector(&local_f8);
  return __return_storage_ptr__;
}

Assistant:

Sequence S_function::operator()(Sequence &seq) {
    std::vector<Sequence> seqs(8);

    // For each subsequence of size 6, map input to output using Sboxes
    for (auto i = 0; i < 8; ++i) {
        Sequence subseq = seq.subsequence(i * 6, (i + 1) * 6);
        seqs[8 - i - 1] = (*m_sboxes[8 - i - 1])(subseq);
    }

    return Sequence({seqs.begin(), seqs.end()});
}